

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O0

void compact_array_suite::test_float32(void)

{
  iterator iVar1;
  iterator iVar2;
  undefined6 local_e0;
  undefined2 uStack_da;
  output_type expected [14];
  array<float,_3UL> value;
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  stack0xffffffffffffff30 = 0xbf80000000000000;
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,
             (array<float,_3UL> *)(expected + 8));
  expected[0] = 0x80;
  expected[1] = 0xbf;
  expected[2] = '\0';
  expected[3] = '\0';
  expected[4] = 0x80;
  expected[5] = '?';
  local_e0 = 0xcad;
  uStack_da = 0;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_std_suite.cpp"
             ,0xd9,"void compact_array_suite::test_float32()",iVar1._M_current,iVar2._M_current,
             &local_e0,expected + 6);
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_float32()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    std::array<token::float32::type, 3> value = {{0.0f, -1.0f, 1.0f}};
    ar << value;

    output_type expected[] = { token::code::array8_float32, 3 * token::float32::size,
                               0x00, 0x00, 0x00, 0x00,
                               0x00, 0x00, 0x80, 0xBF,
                               0x00, 0x00, 0x80, 0x3F };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}